

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarData.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
license::locate::EnvironmentVarData::license_locations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,EnvironmentVarData *this,EventRegistry *eventRegistry)

{
  FILE_FORMAT FVar1;
  char *pcVar2;
  allocator local_49;
  string local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = getenv("LICENSE_DATA");
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    EventRegistry::addEvent
              (eventRegistry,ENVIRONMENT_VARIABLE_NOT_DEFINED,"LICENSE_LOCATION",(char *)0x0);
  }
  else {
    EventRegistry::addEvent(eventRegistry,LICENSE_SPECIFIED,"LICENSE_LOCATION",(char *)0x0);
    std::__cxx11::string::string((string *)&local_48,pcVar2,&local_49);
    FVar1 = identify_format(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (FVar1 == UNKNOWN) {
      EventRegistry::addEvent(eventRegistry,HV,"LICENSE_LOCATION",(char *)0x0);
    }
    else {
      std::__cxx11::string::string((string *)&local_48,"LICENSE_LOCATION",&local_49);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      this->isBase64 = FVar1 == BASE64;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<string> EnvironmentVarData::license_locations(EventRegistry &eventRegistry) {
	vector<string> diskFiles;
	char *env_var_value = getenv(LCC_LICENSE_DATA_ENV_VAR);
	if (env_var_value != nullptr && env_var_value[0] != '\0') {
		eventRegistry.addEvent(LICENSE_SPECIFIED, LCC_LICENSE_LOCATION_ENV_VAR);
		FILE_FORMAT licenseFormat = identify_format(env_var_value);
		if (licenseFormat == UNKNOWN) {
			eventRegistry.addEvent(LICENSE_MALFORMED, LCC_LICENSE_LOCATION_ENV_VAR);
		} else {
			diskFiles.push_back(LCC_LICENSE_LOCATION_ENV_VAR);
			isBase64 = (licenseFormat == BASE64);
		}
	} else {
		eventRegistry.addEvent(ENVIRONMENT_VARIABLE_NOT_DEFINED, LCC_LICENSE_LOCATION_ENV_VAR);
	}
	return diskFiles;
}